

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void * __thiscall Js::FunctionProxy::GetAuxPtr(FunctionProxy *this,AuxPointerType e)

{
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  void *pvVar6;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar7;
  uint8 u;
  long lVar8;
  long lVar9;
  
  if ((this->auxPtrs).ptr == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
LAB_00763fd9:
    pvVar6 = (void *)0x0;
  }
  else {
    pTVar4 = ThreadContext::GetContextForCurrentThread();
    if ((pTVar4 == (ThreadContext *)0x0) &&
       (bVar3 = CCLock::IsLocked(&ThreadContext::s_csThreadContext.super_CCLock), !bVar3)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x70,
                                  "(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked())"
                                  ,
                                  "ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked()"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pAVar1 = (this->auxPtrs).ptr;
    if (pAVar1->count == '\x03') {
      lVar8 = 1;
      pAVar7 = pAVar1;
      while (pAVar7 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
                      (pAVar7->offsets + 6), pAVar1->offsets[lVar8 + -2] != e) {
        lVar8 = lVar8 + 1;
        if (lVar8 == 4) {
          return (void *)0x0;
        }
      }
    }
    else if (pAVar1->count == '\x01') {
      bVar3 = true;
      lVar8 = 0;
      do {
        lVar9 = lVar8;
        if (!bVar3) {
          return (void *)0x0;
        }
        bVar3 = false;
        lVar8 = 1;
      } while (pAVar1->offsets[lVar9 + -1] != e);
      pAVar7 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
               (pAVar1->ptrs + lVar9 + -3);
    }
    else {
      if ((ulong)pAVar1->offsets[e] == 0xff) goto LAB_00763fd9;
      pAVar7 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
               (pAVar1->ptrs + pAVar1->offsets[e]);
    }
    pvVar6 = *(void **)pAVar7;
  }
  return pvVar6;
}

Assistant:

void* FunctionProxy::GetAuxPtr(AuxPointerType e) const
    {
        if (this->auxPtrs == nullptr)
        {
            return nullptr;
        }

        // On process detach this can be called from another thread but the ThreadContext should be locked
        Assert(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked());
        return AuxPtrsT::GetAuxPtr(this, e);
    }